

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O2

Boxed_Value
chaiscript::dispatch::detail::Handle_Return<chaiscript::File_Position>::
handle<chaiscript::File_Position,void>(File_Position *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  File_Position local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::make_shared<chaiscript::File_Position,chaiscript::File_Position>(&local_20);
  Boxed_Value::Object_Data::get<chaiscript::File_Position>
            ((Object_Data *)r,(shared_ptr<chaiscript::File_Position> *)&local_20,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)r;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }